

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void thread_main(void *arg)

{
  ssize_t sVar1;
  int *piVar2;
  char buf [4096];
  
  uv_barrier_wait();
  while( true ) {
    do {
      sVar1 = read(*(int *)((long)arg + 0x20),buf,0x1000);
    } while (0 < sVar1);
    if (sVar1 != -1) break;
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
LAB_0014225c:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
              ,0x33,"n == 0");
      abort();
    }
  }
  if (sVar1 == 0) {
    return;
  }
  goto LAB_0014225c;
}

Assistant:

static void thread_main(void* arg) {
  const struct thread_ctx* ctx;
  int size;
  char* data;

  ctx = (struct thread_ctx*)arg;
  size = ctx->size;
  data = ctx->data;

  while (size > 0) {
    ssize_t result;
    int nbytes;
    nbytes = size < ctx->interval ? size : ctx->interval;
    if (ctx->doread) {
      result = write(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors) */
      ASSERT(result == nbytes);
    } else {
      result = read(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors),
       * but might get a partial read if we are faster than the writer
       */
      ASSERT(result > 0 && result <= nbytes);
    }

    pthread_kill(ctx->pid, SIGUSR1);
    size -= result;
    data += result;
  }
}